

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::RenderPassCreateInfo::RenderPassCreateInfo
          (RenderPassCreateInfo *this,
          vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
          *attachments,
          vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *subpasses,
          vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> *dependiences)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  allocator<vk::VkSubpassDependency> local_c1;
  __normal_iterator<vkt::Draw::SubpassDependency_*,_std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>_>
  local_c0;
  __normal_iterator<vkt::Draw::SubpassDependency_*,_std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>_>
  local_b8;
  allocator<vk::VkSubpassDescription> local_a9;
  __normal_iterator<vkt::Draw::SubpassDescription_*,_std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>_>
  local_a8;
  __normal_iterator<vkt::Draw::SubpassDescription_*,_std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>_>
  local_a0;
  allocator<vk::VkAttachmentDescription> local_91;
  __normal_iterator<vkt::Draw::AttachmentDescription_*,_std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>_>
  local_90;
  __normal_iterator<vkt::Draw::AttachmentDescription_*,_std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>_>
  local_88;
  allocator<vkt::Draw::SubpassDependency> local_79;
  __normal_iterator<const_vk::VkSubpassDependency_*,_std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>_>
  local_78;
  __normal_iterator<const_vk::VkSubpassDependency_*,_std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>_>
  local_70;
  allocator<vkt::Draw::SubpassDescription> local_61;
  __normal_iterator<const_vk::VkSubpassDescription_*,_std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>_>
  local_60;
  __normal_iterator<const_vk::VkSubpassDescription_*,_std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>_>
  local_58;
  allocator<vkt::Draw::AttachmentDescription> local_39;
  __normal_iterator<const_vk::VkAttachmentDescription_*,_std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>_>
  local_38;
  __normal_iterator<const_vk::VkAttachmentDescription_*,_std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>_>
  local_30;
  vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> *local_28;
  vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> *dependiences_local;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *subpasses_local;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
  *attachments_local;
  RenderPassCreateInfo *this_local;
  
  local_28 = dependiences;
  dependiences_local =
       (vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> *)subpasses;
  subpasses_local =
       (vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)attachments;
  attachments_local =
       (vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *)this;
  local_30._M_current =
       (VkAttachmentDescription *)
       std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::begin
                 (attachments);
  local_38._M_current =
       (VkAttachmentDescription *)
       std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::end
                 ((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                   *)subpasses_local);
  std::allocator<vkt::Draw::AttachmentDescription>::allocator(&local_39);
  std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vk::VkAttachmentDescription_const*,std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>>,void>
            ((vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>
              *)&this->m_attachments,local_30,local_38,&local_39);
  std::allocator<vkt::Draw::AttachmentDescription>::~allocator(&local_39);
  local_58._M_current =
       (VkSubpassDescription *)
       std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::begin
                 ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
                  dependiences_local);
  local_60._M_current =
       (VkSubpassDescription *)
       std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::end
                 ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
                  dependiences_local);
  std::allocator<vkt::Draw::SubpassDescription>::allocator(&local_61);
  std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>::
  vector<__gnu_cxx::__normal_iterator<vk::VkSubpassDescription_const*,std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>>,void>
            ((vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>> *)
             &this->m_subpasses,local_58,local_60,&local_61);
  std::allocator<vkt::Draw::SubpassDescription>::~allocator(&local_61);
  local_70._M_current =
       (VkSubpassDependency *)
       std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::begin
                 (local_28);
  local_78._M_current =
       (VkSubpassDependency *)
       std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::end(local_28)
  ;
  std::allocator<vkt::Draw::SubpassDependency>::allocator(&local_79);
  std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vk::VkSubpassDependency_const*,std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>>,void>
            ((vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>> *)
             &this->m_dependiences,local_70,local_78,&local_79);
  std::allocator<vkt::Draw::SubpassDependency>::~allocator(&local_79);
  local_88._M_current =
       (AttachmentDescription *)
       std::
       vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
       begin(&this->m_attachments);
  local_90._M_current =
       (AttachmentDescription *)
       std::
       vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
       end(&this->m_attachments);
  std::allocator<vk::VkAttachmentDescription>::allocator(&local_91);
  std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::AttachmentDescription*,std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>>,void>
            ((vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
             &this->m_attachmentsStructs,local_88,local_90,&local_91);
  std::allocator<vk::VkAttachmentDescription>::~allocator(&local_91);
  local_a0._M_current =
       (SubpassDescription *)
       std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
       begin(&this->m_subpasses);
  local_a8._M_current =
       (SubpassDescription *)
       std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
       end(&this->m_subpasses);
  std::allocator<vk::VkSubpassDescription>::allocator(&local_a9);
  std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDescription*,std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>>,void>
            ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)
             &this->m_subpassesStructs,local_a0,local_a8,&local_a9);
  std::allocator<vk::VkSubpassDescription>::~allocator(&local_a9);
  local_b8._M_current =
       (SubpassDependency *)
       std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
       begin(&this->m_dependiences);
  local_c0._M_current =
       (SubpassDependency *)
       std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::end
                 (&this->m_dependiences);
  std::allocator<vk::VkSubpassDependency>::allocator(&local_c1);
  std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDependency*,std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>>,void>
            ((vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)
             &this->m_dependiencesStructs,local_b8,local_c0,&local_c1);
  std::allocator<vk::VkSubpassDependency>::~allocator(&local_c1);
  (this->super_VkRenderPassCreateInfo).sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  (this->super_VkRenderPassCreateInfo).pNext = (void *)0x0;
  (this->super_VkRenderPassCreateInfo).flags = 0;
  sVar1 = std::
          vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
          ::size(&this->m_attachments);
  (this->super_VkRenderPassCreateInfo).attachmentCount = (deUint32)sVar1;
  pvVar2 = std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
           operator[](&this->m_attachmentsStructs,0);
  (this->super_VkRenderPassCreateInfo).pAttachments = pvVar2;
  sVar1 = std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
          ::size(&this->m_subpasses);
  (this->super_VkRenderPassCreateInfo).subpassCount = (deUint32)sVar1;
  pvVar3 = std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::
           operator[](&this->m_subpassesStructs,0);
  (this->super_VkRenderPassCreateInfo).pSubpasses = pvVar3;
  sVar1 = std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
          size(&this->m_dependiences);
  (this->super_VkRenderPassCreateInfo).dependencyCount = (deUint32)sVar1;
  pvVar4 = std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::
           operator[](&this->m_dependiencesStructs,0);
  (this->super_VkRenderPassCreateInfo).pDependencies = pvVar4;
  return;
}

Assistant:

RenderPassCreateInfo::RenderPassCreateInfo (const std::vector<vk::VkAttachmentDescription>&	attachments,
											const std::vector<vk::VkSubpassDescription>&	subpasses,
											const std::vector<vk::VkSubpassDependency>&		dependiences)

	: m_attachments			(attachments.begin(), attachments.end())
	, m_subpasses			(subpasses.begin(), subpasses.end())
	, m_dependiences		(dependiences.begin(), dependiences.end())
	, m_attachmentsStructs	(m_attachments.begin(), m_attachments.end())
	, m_subpassesStructs	(m_subpasses.begin(), m_subpasses.end())
	, m_dependiencesStructs	(m_dependiences.begin(), m_dependiences.end())
{
	sType = vk::VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
	pNext = DE_NULL;
	flags = 0;

	attachmentCount = static_cast<deUint32>(m_attachments.size());
	pAttachments	= &m_attachmentsStructs[0];
	subpassCount	= static_cast<deUint32>(m_subpasses.size());
	pSubpasses		= &m_subpassesStructs[0];
	dependencyCount = static_cast<deUint32>(m_dependiences.size());
	pDependencies	= &m_dependiencesStructs[0];
}